

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

qcc_stream_data
qcc_stream_data_process
          (qcc_stream_data data,qcc_arena *arena,qcc_stream_node *begin,qcc_stream_node *end,
          qcc_stream_data_process_fn proc)

{
  bool bVar1;
  uint uVar2;
  qcc_list_node *node_00;
  qcc_stream_node *pqVar3;
  qcc_stream_node *node;
  bool bVar4;
  qcc_stream_data qVar5;
  qcc_uint value;
  qcc_stream_node *local_60;
  qcc_stream_node *local_58;
  qcc_arena *local_50;
  qcc_stream_data_process_fn local_48;
  qcc_stream_data result;
  
  local_58 = data.last;
  pqVar3 = data.first;
  local_50 = arena;
  local_48 = proc;
  qcc_list_init((qcc_list *)&result);
  bVar1 = false;
  bVar4 = false;
  local_60 = pqVar3;
  do {
    if (pqVar3 == (qcc_stream_node *)0x0) {
      if (bVar4) {
        local_60 = result.first;
        local_58 = result.last;
      }
      qVar5.last = local_58;
      qVar5.first = local_60;
      return qVar5;
    }
    if (pqVar3 == begin) {
      bVar1 = true;
    }
    if (pqVar3 == end) {
      bVar1 = false;
    }
    value = pqVar3->value;
    if (bVar1) {
      uVar2 = (*local_48)(&value);
      bVar4 = true;
      if (uVar2 == 0) {
        bVar4 = value != pqVar3->value;
        goto LAB_001043c4;
      }
    }
    else {
LAB_001043c4:
      node_00 = (qcc_list_node *)qcc_arena_alloc(local_50,0x10);
      node_00[1].next = (qcc_list_node *)value;
      qcc_list_push_back((qcc_list *)&result,node_00);
    }
    pqVar3 = pqVar3->next;
  } while( true );
}

Assistant:

struct qcc_stream_data
qcc_stream_data_process(struct qcc_stream_data data, struct qcc_arena *arena,
                        const struct qcc_stream_node *begin,
                        const struct qcc_stream_node *end,
                        qcc_stream_data_process_fn proc)
{
    struct qcc_stream_data result;
    qcc_stream_data_init(&result);

    unsigned in_range = 0;
    unsigned is_changed = 0;
    for (struct qcc_stream_node *node = data.first; node; node = node->next)
    {
        if (node == begin) in_range = 1;
        if (node == end) in_range = 0;

        qcc_uint value = node->value;
        if (in_range)
        {
            unsigned skip = proc(&value);
            is_changed = skip || (value != node->value);
            if (skip) continue;
        }

        QCC_ARENA_POD(arena, qcc_stream_node, copy);
        copy->value = value;
        qcc_stream_data_push_back(&result, copy);
    }

    return is_changed ? result : data;
}